

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemSegment
          (BinaryReaderInterp *this,Index index,Index table_index,uint8_t flags)

{
  State *pSVar1;
  Result RVar2;
  Enum EVar3;
  SegmentKind kind;
  Location loc_1;
  Location loc;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  undefined1 local_1b8 [32];
  long local_198;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_190;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_178;
  u32 local_160;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_158;
  undefined1 local_138 [32];
  SegmentKind local_118;
  Index local_114;
  undefined **local_110;
  ExternKind local_108;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_100;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_e8;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_d0;
  u32 local_b8;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_b0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_98;
  Var local_78;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  local_138._24_8_ = local_138._24_8_ & 0xffffffff00000000;
  local_138._0_8_ = (this->filename_)._M_len;
  local_138._8_8_ = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_138._16_8_ = pSVar1->offset;
  local_1b8._24_4_ = 0;
  local_1b8._0_8_ = (this->filename_)._M_len;
  local_1b8._8_8_ = (this->filename_)._M_str;
  local_1b8._16_8_ = pSVar1->offset;
  Var::Var(&local_78,table_index,(Location *)local_1b8);
  RVar2 = SharedValidator::OnElemSegment(&this->validator_,(Location *)local_138,&local_78,kind);
  Var::~Var(&local_78);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
     super__Vector_impl_data._M_start)->enum_ = I32;
    (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
     super__Vector_impl_data._M_start)->type_index_ = 0xffffffff;
    local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
    local_1b8._0_8_ = &PTR__FuncType_0024b220;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_1b8 + 0x10),&local_1d8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_190,&local_98);
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160 = 0xffffffff;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_138._16_8_ = 0;
    local_138._24_8_ = 0xffffffffffffffc0;
    local_108 = local_1b8._8_4_;
    local_110 = &PTR__FuncType_0024b220;
    local_118 = kind;
    local_114 = table_index;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_100,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_1b8 + 0x10));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_e8,&local_190);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              (&local_d0,&local_178);
    local_b8 = local_160;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_b0,&local_158);
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::push_back
              (&this->module_->elems,(value_type *)local_138);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_b0);
    if (local_d0.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d0.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_110 = &PTR__FuncType_0024b220;
    if (local_e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_100.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_158);
    if (local_178.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_1b8._0_8_ = &PTR__FuncType_0024b220;
    if (local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8._16_8_ != 0) {
      operator_delete((void *)local_1b8._16_8_,local_198 - local_1b8._16_8_);
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::BeginElemSegment(Index index,
                                            Index table_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnElemSegment(GetLocation(),
                                        Var(table_index, GetLocation()), mode));

  FuncDesc init_func{
      FuncType{{}, {ValueType::I32}}, {}, Istream::kInvalidOffset, {}};
  ElemDesc desc{{}, ValueType::Void, mode, table_index, init_func};
  module_.elems.push_back(desc);
  return Result::Ok;
}